

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_descriptor.cpp
# Opt level: O0

options_description * __thiscall
program_options::options_description::add(options_description *this,options_description *desc)

{
  ulong uVar1;
  options_description *this_00;
  size_type sVar2;
  long in_RSI;
  options_description *in_RDI;
  reference rVar3;
  size_t i;
  shared_ptr<program_options::options_description> d;
  options_description *in_stack_ffffffffffffff68;
  shared_ptr<program_options::options_description> *in_stack_ffffffffffffff70;
  value_type *in_stack_ffffffffffffff78;
  vector<std::shared_ptr<program_options::options_description>,_std::allocator<std::shared_ptr<program_options::options_description>_>_>
  *in_stack_ffffffffffffff80;
  reference local_58 [2];
  ulong local_38;
  long local_10;
  
  local_10 = in_RSI;
  this_00 = (options_description *)operator_new(0x80);
  options_description(this_00,in_RDI);
  std::shared_ptr<program_options::options_description>::
  shared_ptr<program_options::options_description,void>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::
  vector<std::shared_ptr<program_options::options_description>,_std::allocator<std::shared_ptr<program_options::options_description>_>_>
  ::push_back(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  rVar3._M_mask = (_Bit_type)in_stack_ffffffffffffff70;
  rVar3._M_p = (_Bit_type *)in_stack_ffffffffffffff78;
  local_38 = 0;
  while( true ) {
    uVar1 = local_38;
    sVar2 = std::
            vector<std::shared_ptr<program_options::option_description>,_std::allocator<std::shared_ptr<program_options::option_description>_>_>
            ::size((vector<std::shared_ptr<program_options::option_description>,_std::allocator<std::shared_ptr<program_options::option_description>_>_>
                    *)(local_10 + 0x28));
    if (sVar2 <= uVar1) break;
    std::
    vector<std::shared_ptr<program_options::option_description>,_std::allocator<std::shared_ptr<program_options::option_description>_>_>
    ::operator[]((vector<std::shared_ptr<program_options::option_description>,_std::allocator<std::shared_ptr<program_options::option_description>_>_>
                  *)(local_10 + 0x28),local_38);
    std::shared_ptr<program_options::option_description>::shared_ptr
              ((shared_ptr<program_options::option_description> *)rVar3._M_mask,
               (shared_ptr<program_options::option_description> *)in_stack_ffffffffffffff68);
    add((options_description *)rVar3._M_mask,
        (shared_ptr<program_options::option_description> *)in_stack_ffffffffffffff68);
    std::shared_ptr<program_options::option_description>::~shared_ptr
              ((shared_ptr<program_options::option_description> *)0x1f3149);
    rVar3 = std::vector<bool,_std::allocator<bool>_>::back
                      ((vector<bool,_std::allocator<bool>_> *)this_00);
    local_58[0] = rVar3;
    std::_Bit_reference::operator=(local_58,true);
    local_38 = local_38 + 1;
  }
  std::shared_ptr<program_options::options_description>::~shared_ptr
            ((shared_ptr<program_options::options_description> *)0x1f31ec);
  return in_RDI;
}

Assistant:

options_description& options_description::add(const options_description& desc)
{
    std::shared_ptr<options_description> d(new options_description(desc));
    groups.push_back(d);

    for (size_t i = 0; i < desc.m_options.size(); ++i) {
        add(desc.m_options[i]);
        belong_to_group.back() = true;
    }

    return *this;
}